

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::checkAttDerivationOK
          (TraverseSchema *this,DOMElement *elem,XercesAttGroupInfo *baseAttGrpInfo,
          XercesAttGroupInfo *childAttGrpInfo)

{
  bool bVar1;
  uint uVar2;
  DefAttTypes DVar3;
  DefAttTypes DVar4;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  SchemaAttDef *pSVar7;
  XMLSize_t XVar8;
  SchemaAttDef *this_00;
  QName *this_01;
  XMLCh *baseName;
  SchemaAttDef *this_02;
  DatatypeValidator *pDVar9;
  DatatypeValidator *pDVar10;
  XMLCh *str1;
  XMLCh *str2;
  SchemaAttDef *local_d0;
  SchemaAttDef *local_a8;
  SchemaAttDef *childAttWildCard;
  DatatypeValidator *childDV;
  DatatypeValidator *baseDV;
  DefAttTypes childAttDefType;
  DefAttTypes baseAttDefType;
  SchemaAttDef *baseAttDef;
  XMLCh *childLocalPart;
  QName *childAttName;
  SchemaAttDef *childAttDef;
  XMLSize_t i;
  SchemaAttDef *baseAttWildCard;
  XMLSize_t childAnyAttCount;
  XMLSize_t childAttCount;
  XMLSize_t baseAnyAttCount;
  XMLSize_t baseAttCount;
  XercesAttGroupInfo *childAttGrpInfo_local;
  XercesAttGroupInfo *baseAttGrpInfo_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  XVar5 = XercesAttGroupInfo::attributeCount(baseAttGrpInfo);
  XVar6 = XercesAttGroupInfo::anyAttributeCount(baseAttGrpInfo);
  pSVar7 = (SchemaAttDef *)XercesAttGroupInfo::attributeCount(childAttGrpInfo);
  XVar8 = XercesAttGroupInfo::anyAttributeCount(childAttGrpInfo);
  if ((((pSVar7 != (SchemaAttDef *)0x0) || (XVar8 != 0)) && (XVar5 == 0)) && (XVar6 == 0)) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6d);
  }
  if (XVar6 == 0) {
    local_a8 = (SchemaAttDef *)0x0;
  }
  else {
    local_a8 = XercesAttGroupInfo::anyAttributeAt(baseAttGrpInfo,0);
  }
  childAttDef = (SchemaAttDef *)0x0;
  do {
    if (pSVar7 <= childAttDef) {
      if (XVar8 == 0) {
        local_d0 = (SchemaAttDef *)0x0;
      }
      else {
        local_d0 = XercesAttGroupInfo::anyAttributeAt(childAttGrpInfo,0);
      }
      if (local_d0 != (SchemaAttDef *)0x0) {
        if (local_a8 == (SchemaAttDef *)0x0) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x72);
        }
        else {
          bVar1 = isWildCardSubset(this,local_a8,local_d0);
          if (bVar1) {
            DVar3 = XMLAttDef::getDefaultType(&local_d0->super_XMLAttDef);
            DVar4 = XMLAttDef::getDefaultType(&local_a8->super_XMLAttDef);
            if (DVar3 < DVar4) {
              reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x75);
            }
          }
          else {
            reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x73);
          }
        }
      }
      return;
    }
    this_00 = XercesAttGroupInfo::attributeAt(childAttGrpInfo,(XMLSize_t)childAttDef);
    this_01 = SchemaAttDef::getAttName(this_00);
    baseName = QName::getLocalPart(this_01);
    uVar2 = QName::getURI(this_01);
    this_02 = XercesAttGroupInfo::getAttDef(baseAttGrpInfo,baseName,uVar2);
    if (this_02 == (SchemaAttDef *)0x0) {
      if (local_a8 != (SchemaAttDef *)0x0) {
        uVar2 = QName::getURI(this_01);
        bVar1 = wildcardAllowsNamespace(this,local_a8,uVar2);
        if (bVar1) goto LAB_00437451;
      }
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x71,baseName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      DVar3 = XMLAttDef::getDefaultType(&this_02->super_XMLAttDef);
      DVar4 = XMLAttDef::getDefaultType(&this_00->super_XMLAttDef);
      if ((DVar3 == DefAttTypes_Max) && (DVar4 != DefAttTypes_Max)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x74,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (((DVar3 & Required) != DefAttTypes_Min) && ((DVar4 & Required) == DefAttTypes_Min)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6e,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (DVar4 != DefAttTypes_Max) {
        pDVar9 = SchemaAttDef::getDatatypeValidator(this_02);
        pDVar10 = SchemaAttDef::getDatatypeValidator(this_00);
        if ((pDVar9 == (DatatypeValidator *)0x0) ||
           (uVar2 = (*(pDVar9->super_XSerializable)._vptr_XSerializable[9])(pDVar9,pDVar10),
           (uVar2 & 1) == 0)) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6f,baseName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        if ((DVar3 & Fixed) != DefAttTypes_Min) {
          if ((DVar4 & Fixed) != DefAttTypes_Min) {
            str1 = XMLAttDef::getValue(&this_02->super_XMLAttDef);
            str2 = XMLAttDef::getValue(&this_00->super_XMLAttDef);
            bVar1 = XMLString::equals(str1,str2);
            if (bVar1) goto LAB_00437451;
          }
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x70,baseName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
    }
LAB_00437451:
    childAttDef = (SchemaAttDef *)
                  ((long)&(childAttDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1
                  );
  } while( true );
}

Assistant:

void TraverseSchema::checkAttDerivationOK(const DOMElement* const elem,
                                          const XercesAttGroupInfo* const baseAttGrpInfo,
                                          const XercesAttGroupInfo* const childAttGrpInfo) {

    XMLSize_t baseAttCount = baseAttGrpInfo->attributeCount();
    XMLSize_t baseAnyAttCount = baseAttGrpInfo->anyAttributeCount();
    XMLSize_t childAttCount = childAttGrpInfo->attributeCount();
    XMLSize_t childAnyAttCount = childAttGrpInfo->anyAttributeCount();

    if ((childAttCount || childAnyAttCount) && (!baseAttCount && !baseAnyAttCount)) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_1);
    }

    const SchemaAttDef* baseAttWildCard = (baseAnyAttCount) ? baseAttGrpInfo->anyAttributeAt(0) : 0;

    for (XMLSize_t i=0; i<childAttCount; i++) {

        const SchemaAttDef* childAttDef = childAttGrpInfo->attributeAt(i);
        QName* childAttName = childAttDef->getAttName();
        const XMLCh* childLocalPart = childAttName->getLocalPart();
        const SchemaAttDef* baseAttDef = baseAttGrpInfo->getAttDef(childLocalPart, childAttName->getURI());

        if (baseAttDef) {

            XMLAttDef::DefAttTypes baseAttDefType = baseAttDef->getDefaultType();
            XMLAttDef::DefAttTypes childAttDefType = childAttDef->getDefaultType();

            // Constraint 2.1.1 & 3 + check for prohibited base attribute
            if (baseAttDefType == XMLAttDef::Prohibited
                && childAttDefType != XMLAttDef::Prohibited) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_8, childLocalPart);
            }

            if ((baseAttDefType & XMLAttDef::Required)
                && !(childAttDefType & XMLAttDef::Required)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_2, childLocalPart);
            }

            // if the attribute in the derived type is prohibited, and it didn't try to override a required attribute,
            // it's ok and shouldn't be tested for data type or fixed value
            if (childAttDefType == XMLAttDef::Prohibited)
                continue;

            // Constraint 2.1.2
            DatatypeValidator* baseDV = baseAttDef->getDatatypeValidator();
            DatatypeValidator* childDV = childAttDef->getDatatypeValidator();
            if (!baseDV || !baseDV->isSubstitutableBy(childDV)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_3, childLocalPart);
            }

            // Constraint 2.1.3
            if ((baseAttDefType & XMLAttDef::Fixed) &&
                (!(childAttDefType & XMLAttDef::Fixed) ||
                 !XMLString::equals(baseAttDef->getValue(), childAttDef->getValue()))) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_4, childLocalPart);
            }
        }
        // Constraint 2.2
        else if (!baseAttWildCard ||
                 !wildcardAllowsNamespace(baseAttWildCard, childAttName->getURI())) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_5, childLocalPart);
        }
    }

    // Constraint 4
    const SchemaAttDef* childAttWildCard = (childAnyAttCount) ? childAttGrpInfo->anyAttributeAt(0) : 0;

    if (childAttWildCard) {

        if (!baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_6);
        }
        else if (!isWildCardSubset(baseAttWildCard, childAttWildCard)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_7);
        }
        else if (childAttWildCard->getDefaultType() < baseAttWildCard->getDefaultType()) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_9);
        }
    }
}